

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

char * ggml_status_to_string(ggml_status status)

{
  ggml_status status_local;
  char *local_8;
  
  switch(status) {
  case GGML_STATUS_SUCCESS:
    local_8 = "GGML status: success";
    break;
  case GGML_STATUS_ABORTED:
    local_8 = "GGML status: warning (operation aborted)";
    break;
  case GGML_STATUS_ALLOC_FAILED:
    local_8 = "GGML status: error (failed to allocate memory)";
    break;
  case GGML_STATUS_FAILED:
    local_8 = "GGML status: error (operation failed)";
    break;
  default:
    local_8 = "GGML status: unknown";
  }
  return local_8;
}

Assistant:

const char * ggml_status_to_string(enum ggml_status status) {
    switch (status) {
        case GGML_STATUS_ALLOC_FAILED: return "GGML status: error (failed to allocate memory)";
        case GGML_STATUS_FAILED:       return "GGML status: error (operation failed)";
        case GGML_STATUS_SUCCESS:      return "GGML status: success";
        case GGML_STATUS_ABORTED:      return "GGML status: warning (operation aborted)";
    }

    return "GGML status: unknown";
}